

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall trieste::SymtabDef::str(SymtabDef *this,ostream *out,size_t level)

{
  _Base_ptr p_Var1;
  pointer psVar2;
  ostream *poVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  shared_ptr<trieste::NodeDef> *node_1;
  pointer psVar6;
  iterator __begin3;
  _Base_ptr p_Var7;
  string_view sVar8;
  
  poVar3 = trieste::operator<<(out,(indent)level);
  std::operator<<((ostream *)poVar3,"{");
  for (p_Var5 = (this->symbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(this->symbols)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5)) {
    poVar4 = std::endl<char,std::char_traits<char>>((ostream *)out);
    poVar3 = trieste::operator<<((ostream *)poVar4,(indent)(level + 1));
    sVar8 = Location::view((Location *)(p_Var5 + 1));
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar3,sVar8._M_str,sVar8._M_len);
    std::operator<<(poVar4," =");
    p_Var7 = *(_Base_ptr *)(p_Var5 + 2);
    p_Var1 = p_Var5[2]._M_parent;
    if ((long)p_Var1 - (long)p_Var7 == 0x10) {
      poVar4 = std::operator<<((ostream *)out," ");
      std::operator<<(poVar4,*(char **)(p_Var5[2]._M_parent[-1]._M_left)->_M_left);
    }
    else {
      for (; p_Var7 != p_Var1; p_Var7 = (_Base_ptr)&p_Var7->_M_left) {
        poVar4 = std::endl<char,std::char_traits<char>>((ostream *)out);
        poVar3 = trieste::operator<<((ostream *)poVar4,(indent)(level + 2));
        std::operator<<((ostream *)poVar3,(char *)**(undefined8 **)(*(long *)p_Var7 + 0x10));
      }
    }
  }
  psVar2 = (this->includes).
           super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar6 = (this->includes).
                super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar2; psVar6 = psVar6 + 1) {
    poVar4 = std::endl<char,std::char_traits<char>>((ostream *)out);
    poVar3 = trieste::operator<<((ostream *)poVar4,(indent)(level + 1));
    poVar4 = std::operator<<((ostream *)poVar3,"include ");
    sVar8 = Location::view(&((psVar6->
                             super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr)->location_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,sVar8._M_str,sVar8._M_len);
  }
  std::operator<<((ostream *)out,"}");
  return;
}

Assistant:

inline void SymtabDef::str(std::ostream& out, size_t level)
  {
    out << indent(level) << "{";

    for (auto& [loc, sym] : symbols)
    {
      out << std::endl << indent(level + 1) << loc.view() << " =";

      if (sym.size() == 1)
      {
        out << " " << sym.back()->type().str();
      }
      else
      {
        for (auto& node : sym)
          out << std::endl << indent(level + 2) << node->type().str();
      }
    }

    for (auto& node : includes)
    {
      out << std::endl
          << indent(level + 1) << "include " << node->location().view();
    }

    out << "}";
  }